

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::saveVectors(FastText *this,string *filename)

{
  byte bVar1;
  int32_t iVar2;
  invalid_argument *this_00;
  element_type *peVar3;
  ostream *poVar4;
  ostream *os;
  element_type *peVar5;
  Dictionary *this_01;
  string *in_RSI;
  string word;
  int32_t i;
  Vector vec;
  ofstream ofs;
  char *in_stack_fffffffffffffd40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd50;
  string local_288 [8];
  string *in_stack_fffffffffffffd80;
  Vector *in_stack_fffffffffffffd88;
  FastText *in_stack_fffffffffffffd90;
  int local_264;
  string local_240 [48];
  ostream local_210 [528];
  
  std::ofstream::ofstream(local_210,in_RSI,_S_out);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
    std::invalid_argument::invalid_argument(this_00,local_240);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  peVar3 = std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x16ea88);
  iVar2 = Dictionary::nwords(peVar3);
  poVar4 = (ostream *)std::ostream::operator<<(local_210,iVar2);
  os = std::operator<<(poVar4," ");
  peVar5 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x16ead0);
  this_01 = (Dictionary *)std::ostream::operator<<(os,peVar5->dim);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x16eb01);
  Vector::Vector((Vector *)CONCAT44(iVar2,in_stack_fffffffffffffd50),(int64_t)poVar4);
  local_264 = 0;
  while( true ) {
    peVar3 = std::
             __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x16eb38);
    iVar2 = Dictionary::nwords(peVar3);
    if (iVar2 <= local_264) break;
    std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x16eb64);
    Dictionary::getWord_abi_cxx11_(this_01,iVar2);
    getWordVector(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
    poVar4 = std::operator<<(local_210,local_288);
    std::operator<<(poVar4," ");
    poVar4 = operator<<(os,(Vector *)this_01);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_288);
    local_264 = local_264 + 1;
  }
  Vector::~Vector((Vector *)0x16ec51);
  std::ofstream::~ofstream(local_210);
  return;
}

Assistant:

void FastText::saveVectors(const std::string& filename) {
  std::ofstream ofs(filename);
  if (!ofs.is_open()) {
    throw std::invalid_argument(
        filename + " cannot be opened for saving vectors!");
  }
  ofs << dict_->nwords() << " " << args_->dim << std::endl;
  Vector vec(args_->dim);
  for (int32_t i = 0; i < dict_->nwords(); i++) {
    std::string word = dict_->getWord(i);
    getWordVector(vec, word);
    ofs << word << " " << vec << std::endl;
  }
}